

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSender.cpp
# Opt level: O2

void __thiscall
MyServerConnection::OnData(MyServerConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  uint32_t uVar1;
  long lVar2;
  uint64_t localUsec;
  uint8_t pong_message [12];
  
  if (bytes == 9 && channel == 0x33) {
    pong_message[0] = 'N';
    for (lVar2 = 1; lVar2 != 9; lVar2 = lVar2 + 1) {
      pong_message[lVar2] = data[lVar2];
    }
    localUsec = tonk_time();
    uVar1 = tonk::SDKConnection::ToRemoteTime23(&this->super_SDKConnection,localUsec);
    pong_message[0xb] = (uint8_t)(uVar1 >> 0x10);
    pong_message._9_2_ = (undefined2)uVar1;
    tonk::SDKConnection::Send(&this->super_SDKConnection,pong_message,0xc,0x33);
  }
  return;
}

Assistant:

void MyServerConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (channel == TonkChannel_Reliable1 && bytes == 9)
    {
        uint8_t pong_message[1 + 8 + 3];
        pong_message[0] = 78;
        for (int i = 0; i < 8; ++i) {
            pong_message[i + 1] = data[i + 1];
        }
        uint32_t remoteTS23 = ToRemoteTime23(tonk_time());
        tonk::WriteU24_LE(pong_message + 1 + 8, remoteTS23);
        Send(pong_message, 1 + 8 + 3, channel);
    }
}